

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mos6502.cpp
# Opt level: O0

void __thiscall
n_e_s::core::Mos6502::set_overflow
          (Mos6502 *this,uint8_t reg_value,uint8_t operand,uint16_t resulting_value)

{
  bool overflow;
  uint8_t b;
  uint8_t a;
  uint16_t resulting_value_local;
  uint8_t operand_local;
  uint8_t reg_value_local;
  Mos6502 *this_local;
  
  if (((reg_value ^ (byte)resulting_value) & (operand ^ (byte)resulting_value) & 0x80) == 0) {
    clear_flag(this,'@');
  }
  else {
    set_flag(this,'@');
  }
  return;
}

Assistant:

void Mos6502::set_overflow(uint8_t reg_value,
        uint8_t operand,
        uint16_t resulting_value) {
    // See: http://www.righto.com/2012/12/the-6502-overflow-flag-explained.html
    auto a = static_cast<uint8_t>(reg_value ^ resulting_value);
    auto b = static_cast<uint8_t>(operand ^ resulting_value);
    const bool overflow = (static_cast<uint8_t>(a & b) & 0x80u) != 0;
    if (overflow) {
        set_flag(V_FLAG);
    } else {
        clear_flag(V_FLAG);
    }
}